

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.cc
# Opt level: O3

void __thiscall PcodeOpBank::insertAfterDead(PcodeOpBank *this,PcodeOp *op,PcodeOp *prev)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  LowlevelError *this_00;
  string local_48;
  
  if (((op->flags & 0x20) != 0) && ((prev->flags & 0x20) != 0)) {
    p_Var2 = (op->insertiter)._M_node;
    psVar1 = &(this->deadlist).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var2);
    p_Var2 = (_List_node_base *)operator_new(0x18);
    p_Var2[1]._M_next = (_List_node_base *)op;
    std::__detail::_List_node_base::_M_hook(p_Var2);
    psVar1 = &(this->deadlist).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 + 1;
    (op->insertiter)._M_node = p_Var2;
    return;
  }
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Dead move called on ops which aren\'t dead","");
  LowlevelError::LowlevelError(this_00,&local_48);
  __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void PcodeOp::setNumInputs(int4 num)

{
  inrefs.resize(num);
  for(int4 i=0;i<num;++i)
    inrefs[i] = (Varnode *)0;
}